

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O3

void Ssw_RarManStop(Ssw_RarMan_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  
  if (p->vCexes != (Vec_Ptr_t *)0x0) {
    if (p->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                    ,0x313,"void Ssw_RarManStop(Ssw_RarMan_t *)");
    }
    p->pAig->vSeqModelVec = p->vCexes;
    p->vCexes = (Vec_Ptr_t *)0x0;
  }
  if (p->ppClasses != (Ssw_Cla_t *)0x0) {
    Ssw_ClassesStop(p->ppClasses);
  }
  pVVar1 = p->vInits;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vInits->pArray = (int *)0x0;
      pVVar1 = p->vInits;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_006af906;
    }
    free(pVVar1);
    p->vInits = (Vec_Int_t *)0x0;
  }
LAB_006af906:
  pVVar1 = p->vPatBests;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vPatBests->pArray = (int *)0x0;
      pVVar1 = p->vPatBests;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_006af942;
    }
    free(pVVar1);
    p->vPatBests = (Vec_Int_t *)0x0;
  }
LAB_006af942:
  pVVar2 = p->vUpdConst;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      p->vUpdConst->pArray = (void **)0x0;
      pVVar2 = p->vUpdConst;
      if (pVVar2 == (Vec_Ptr_t *)0x0) goto LAB_006af97e;
    }
    free(pVVar2);
    p->vUpdConst = (Vec_Ptr_t *)0x0;
  }
LAB_006af97e:
  pVVar2 = p->vUpdClass;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      p->vUpdClass->pArray = (void **)0x0;
      pVVar2 = p->vUpdClass;
      if (pVVar2 == (Vec_Ptr_t *)0x0) goto LAB_006af9ba;
    }
    free(pVVar2);
    p->vUpdClass = (Vec_Ptr_t *)0x0;
  }
LAB_006af9ba:
  if (p->pObjData != (word *)0x0) {
    free(p->pObjData);
    p->pObjData = (word *)0x0;
  }
  if (p->pPatData != (word *)0x0) {
    free(p->pPatData);
    p->pPatData = (word *)0x0;
  }
  if (p->pPatCosts != (double *)0x0) {
    free(p->pPatCosts);
    p->pPatCosts = (double *)0x0;
  }
  if (p->pRarity != (int *)0x0) {
    free(p->pRarity);
  }
  free(p);
  return;
}

Assistant:

static void Ssw_RarManStop( Ssw_RarMan_t * p )
{
//    Vec_PtrFreeP( &p->vCexes );
    if ( p->vCexes )
    {
        assert( p->pAig->vSeqModelVec == NULL );
        p->pAig->vSeqModelVec = p->vCexes;
        p->vCexes = NULL;
    }
    if ( p->ppClasses ) Ssw_ClassesStop( p->ppClasses );
    Vec_IntFreeP( &p->vInits );
    Vec_IntFreeP( &p->vPatBests );
    Vec_PtrFreeP( &p->vUpdConst );
    Vec_PtrFreeP( &p->vUpdClass );
    ABC_FREE( p->pObjData );
    ABC_FREE( p->pPatData );
    ABC_FREE( p->pPatCosts );
    ABC_FREE( p->pRarity );
    ABC_FREE( p );
}